

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

_Bool oonf_layer2_neigh_remove(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin)

{
  uint8_t *puVar1;
  list_entity *plVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  list_entity *plVar8;
  
  if ((l2neigh->_node).list.next == (list_entity *)0x0) {
    bVar5 = false;
  }
  else if ((l2neigh->_node).list.prev == (list_entity *)0x0) {
    bVar5 = false;
  }
  else {
    plVar8 = (l2neigh->destinations).list_head.next;
    if (plVar8->prev == (l2neigh->destinations).list_head.prev) {
      bVar4 = 0;
      bVar3 = 0;
    }
    else {
      bVar4 = 0;
      bVar3 = 0;
      do {
        plVar2 = plVar8->next;
        if ((oonf_layer2_origin *)plVar8[-1].prev == origin) {
          oonf_layer2_destination_remove((oonf_layer2_destination *)&plVar8[-3].prev);
          bVar4 = 1;
          bVar3 = 1;
        }
        plVar8 = plVar2;
      } while (plVar2->prev != (l2neigh->destinations).list_head.prev);
    }
    plVar8 = (l2neigh->remote_neighbor_ips).list_head.next;
    if (plVar8->prev != (l2neigh->remote_neighbor_ips).list_head.prev) {
      do {
        plVar2 = plVar8->next;
        iVar6 = oonf_layer2_neigh_remove_ip((oonf_layer2_neighbor_address *)(plVar8 + -6),origin);
        bVar3 = bVar4;
        if (iVar6 == 0) {
          bVar3 = 1;
        }
        plVar8 = plVar2;
        bVar4 = bVar3;
      } while (plVar2->prev != (l2neigh->remote_neighbor_ips).list_head.prev);
    }
    lVar7 = 0xd0;
    bVar4 = 0;
    do {
      if (*(oonf_layer2_origin **)((l2neigh->key).addr._addr + lVar7) == origin) {
        puVar1 = (l2neigh->key).addr._addr + lVar7 + -8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        bVar4 = 1;
      }
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0x4e0);
    bVar5 = (bool)(bVar4 | bVar3);
    if (bVar5) {
      oonf_layer2_neigh_commit(l2neigh);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}